

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O1

Value * duckdb::HTTPProxyUsernameSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  pointer pcVar1;
  DBConfig *pDVar2;
  string local_38;
  
  pDVar2 = DBConfig::GetConfig(context);
  pcVar1 = (pDVar2->options).http_proxy_username._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,
             pcVar1 + (pDVar2->options).http_proxy_username._M_string_length);
  Value::Value(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Value HTTPProxyUsernameSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	return Value(config.options.http_proxy_username);
}